

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O2

bool __thiscall GraphViewer::resetVertexIcon(GraphViewer *this)

{
  Connection *this_00;
  bool bVar1;
  string str;
  char buff [200];
  allocator local_119;
  string local_118;
  string local_f8 [32];
  char local_d8 [200];
  
  builtin_strncpy(local_d8,"resetVertexIcon\n",0x11);
  std::__cxx11::string::string(local_f8,local_d8,&local_119);
  this_00 = this->con;
  std::__cxx11::string::string((string *)&local_118,local_f8);
  bVar1 = Connection::sendMsg(this_00,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string(local_f8);
  return bVar1;
}

Assistant:

bool GraphViewer::resetVertexIcon() {
	char buff[200];
	sprintf(buff, "resetVertexIcon\n");
	string str(buff);
	return con->sendMsg(str);
}